

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O1

void FACT_INTERNAL_ActivateEvent
               (FACTSoundInstance *sound,FACTTrack *track,FACTTrackInstance *trackInst,
               FACTEvent *evt,FACTEventInstance *evtInst,uint32_t elapsed)

{
  byte bVar1;
  uint16_t uVar2;
  ushort uVar3;
  FACTWave *pFVar4;
  FACTEventInstance *pFVar5;
  FACTCue *pFVar6;
  FACTTrack *pFVar7;
  uint uVar8;
  FACTSound *pFVar9;
  long lVar10;
  ulong uVar11;
  FACTTrackInstance *pFVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  switch(evt->type) {
  case 0:
    bVar1 = (evt->field_3).wave.flags;
    if ((bVar1 & 2) == 0) {
      pFVar4 = (trackInst->activeWave).wave;
      if (pFVar4 != (FACTWave *)0x0) {
        FACTWave_Stop(pFVar4,bVar1 & 1);
      }
      pFVar4 = (trackInst->upcomingWave).wave;
      if (pFVar4 != (FACTWave *)0x0) {
        FACTWave_Destroy(pFVar4);
        (trackInst->upcomingWave).wave = (FACTWave *)0x0;
      }
      bVar1 = track->eventCount;
      if (bVar1 != 0) {
        pFVar5 = trackInst->events;
        lVar10 = 0;
        do {
          *(undefined2 *)((long)&pFVar5->loopCount + lVar10) = 0;
          (&pFVar5->finished)[lVar10] = '\x01';
          lVar10 = lVar10 + 0xc;
        } while ((ulong)bVar1 * 0xc != lVar10);
      }
    }
    else {
      if ((bVar1 & 1) == 0) {
        pFVar6 = sound->parentCue;
        uVar2 = pFVar6->parentBank->cues[pFVar6->index].fadeOutMS;
        if (uVar2 != 0) {
          FACT_INTERNAL_BeginFadeOut(sound,uVar2);
          break;
        }
        if (pFVar6->maxRpcReleaseTime != 0) {
          if (pFVar6->maxRpcReleaseTime == 0) {
            *(byte *)&pFVar6->state = (byte)pFVar6->state | 0x10;
          }
          else {
            FACT_INTERNAL_BeginReleaseRPC(sound,(uint16_t)pFVar6->maxRpcReleaseTime);
          }
          break;
        }
      }
      pFVar9 = sound->sound;
      if (pFVar9->trackCount != '\0') {
        uVar11 = 0;
        do {
          pFVar7 = pFVar9->tracks;
          pFVar12 = sound->tracks;
          pFVar4 = pFVar12[uVar11].activeWave.wave;
          if (pFVar4 != (FACTWave *)0x0) {
            FACTWave_Stop(pFVar4,1);
          }
          pFVar12 = pFVar12 + uVar11;
          pFVar4 = (pFVar12->upcomingWave).wave;
          if (pFVar4 != (FACTWave *)0x0) {
            FACTWave_Destroy(pFVar4);
            (pFVar12->upcomingWave).wave = (FACTWave *)0x0;
          }
          bVar1 = pFVar7[uVar11].eventCount;
          if (bVar1 != 0) {
            pFVar5 = pFVar12->events;
            lVar10 = 0;
            do {
              *(undefined2 *)((long)&pFVar5->loopCount + lVar10) = 0;
              (&pFVar5->finished)[lVar10] = '\x01';
              lVar10 = lVar10 + 0xc;
            } while ((ulong)bVar1 * 0xc != lVar10);
          }
          uVar11 = uVar11 + 1;
          pFVar9 = sound->sound;
        } while (uVar11 < pFVar9->trackCount);
      }
    }
    break;
  case 1:
  case 3:
  case 4:
  case 6:
    SDL_memcpy(&trackInst->activeWave,&trackInst->upcomingWave,0x18);
    (trackInst->upcomingWave).wave = (FACTWave *)0x0;
    FACTWave_Play((trackInst->activeWave).wave);
    break;
  case 7:
  case 8:
  case 0x10:
  case 0x11:
    if (((evt->field_3).wave.flags & 1) == 0) {
      if ((undefined1  [72])((undefined1  [72])evt->field_3 & (undefined1  [72])0x4) ==
          (undefined1  [72])0x0) {
        fVar14 = 0.0;
        if ((undefined1  [72])((undefined1  [72])evt->field_3 & (undefined1  [72])0x8) !=
            (undefined1  [72])0x0) {
          fVar14 = *(float *)((long)&evt->field_3 + 0xc);
          uVar8 = stb_rand();
          fVar14 = (*(float *)((long)&evt->field_3 + 0x10) - *(float *)((long)&evt->field_3 + 0xc))
                   * (float)((double)uVar8 * 2.3283064365386963e-10) + fVar14;
        }
      }
      else {
        fVar14 = *(float *)((long)&evt->field_3 + 0xc);
      }
      bVar13 = true;
      if ((undefined1  [72])((undefined1  [72])evt->field_3 & (undefined1  [72])0x1) !=
          (undefined1  [72])0x0) {
        if ((evt->type == 0x10) || (evt->type == 7)) {
          fVar14 = fVar14 + trackInst->evtPitch;
        }
        else {
          fVar14 = fVar14 + trackInst->evtVolume;
        }
      }
    }
    else {
      uVar8 = (uint)*(ushort *)((long)&evt->field_3 + 0x14);
      fVar15 = (float)uVar8;
      bVar13 = evtInst->timestamp + uVar8 < elapsed;
      fVar14 = *(float *)((long)&evt->field_3 + 8);
      fVar17 = (float)(elapsed - evtInst->timestamp) / fVar15;
      fVar16 = 1.0;
      if (fVar17 <= 1.0) {
        fVar16 = fVar17;
      }
      fVar14 = fVar16 * ((((*(float *)((long)&evt->field_3 + 0xc) * fVar15) / 1000.0) * 10.0 +
                         fVar14) - fVar14) + fVar14;
    }
    (evtInst->field_3).value = fVar14;
    if ((evt->type == 0x10) || (evt->type == 7)) {
      trackInst->evtPitch = (float)evtInst->field_3;
    }
    else {
      trackInst->evtVolume = (float)evtInst->field_3;
    }
    if (!bVar13) {
      return;
    }
    uVar2 = evtInst->loopCount;
    if (uVar2 != 0) {
      if ((uVar2 != 0xff) && (uVar2 != 0xffff)) {
        evtInst->loopCount = uVar2 - 1;
      }
      uVar3 = (evt->field_3).wave.angle;
LAB_0010ef52:
      evtInst->timestamp = evtInst->timestamp + (uint)uVar3;
      return;
    }
    break;
  case 9:
  case 0x12:
    uVar2 = evtInst->loopCount;
    if (uVar2 != 0) {
      if (uVar2 != 0xff) {
        evtInst->loopCount = uVar2 - 1;
      }
      uVar3 = (evt->field_3).marker.frequency;
      goto LAB_0010ef52;
    }
  }
  evtInst->finished = '\x01';
  return;
}

Assistant:

void FACT_INTERNAL_ActivateEvent(
	FACTSoundInstance *sound,
	FACTTrack *track,
	FACTTrackInstance *trackInst,
	FACTEvent *evt,
	FACTEventInstance *evtInst,
	uint32_t elapsed
) {
	uint8_t i;
	float svResult;
	uint8_t skipLoopCheck = 0;

	/* STOP */
	if (evt->type == FACTEVENT_STOP)
	{
		/* Stop Cue */
		if (evt->stop.flags & 0x02)
		{
			if (	evt->stop.flags & 0x01 ||
				(	sound->parentCue->parentBank->cues[sound->parentCue->index].fadeOutMS == 0 &&
					sound->parentCue->maxRpcReleaseTime == 0	)	)
			{
				for (i = 0; i < sound->sound->trackCount; i += 1)
				{
					FACT_INTERNAL_StopTrack(
						&sound->sound->tracks[i],
						&sound->tracks[i],
						1
					);
				}
			}
			else
			{
				if (sound->parentCue->parentBank->cues[sound->parentCue->index].fadeOutMS > 0)
				{
					FACT_INTERNAL_BeginFadeOut(
						sound,
						sound->parentCue->parentBank->cues[sound->parentCue->index].fadeOutMS
					);
				}
				else if (sound->parentCue->maxRpcReleaseTime > 0)
				{
					FACT_INTERNAL_BeginReleaseRPC(
						sound,
						sound->parentCue->maxRpcReleaseTime
					);
				}
				else
				{
					/* Pretty sure this doesn't happen, but just in case? */
					sound->parentCue->state |= FACT_STATE_STOPPING;
				}
			}
		}

		/* Stop track */
		else
		{
			FACT_INTERNAL_StopTrack(
				track,
				trackInst,
				evt->stop.flags & 0x01
			);
		}
	}

	/* PLAYWAVE */
	else if (	evt->type == FACTEVENT_PLAYWAVE ||
			evt->type == FACTEVENT_PLAYWAVETRACKVARIATION ||
			evt->type == FACTEVENT_PLAYWAVEEFFECTVARIATION ||
			evt->type == FACTEVENT_PLAYWAVETRACKEFFECTVARIATION	)
	{
		FAudio_assert(trackInst->activeWave.wave == NULL);
		FAudio_assert(trackInst->upcomingWave.wave != NULL);
		FAudio_memcpy(
			&trackInst->activeWave,
			&trackInst->upcomingWave,
			sizeof(trackInst->activeWave)
		);
		trackInst->upcomingWave.wave = NULL;
		FACTWave_Play(trackInst->activeWave.wave);
	}

	/* SETVALUE */
	else if (	evt->type == FACTEVENT_PITCH ||
			evt->type == FACTEVENT_PITCHREPEATING ||
			evt->type == FACTEVENT_VOLUME ||
			evt->type == FACTEVENT_VOLUMEREPEATING	)
	{
		/* Ramp/Equation */
		if (evt->value.settings & 0x01)
		{
			/* FIXME: Incorporate 2nd derivative into the interpolated pitch (slopeDelta) */
			skipLoopCheck = elapsed <= (evtInst->timestamp + evt->value.ramp.duration);
			svResult = (
				evt->value.ramp.initialSlope *
				evt->value.ramp.duration / 1000 *
				10 /* "Slices" */
			) + evt->value.ramp.initialValue;
			svResult = (
				(svResult - evt->value.ramp.initialValue)
			) * FAudio_clamp(
				(float) (elapsed - evtInst->timestamp) / evt->value.ramp.duration,
				0.0f,
				1.0f
			) + evt->value.ramp.initialValue;

			evtInst->value = svResult;
		}
		else
		{
			/* Value/Random */
			if (evt->value.equation.flags & 0x04)
			{
				svResult = evt->value.equation.value1;
			}
			else if (evt->value.equation.flags & 0x08)
			{
				svResult = evt->value.equation.value1 + FACT_INTERNAL_rng() * (
					evt->value.equation.value2 -
					evt->value.equation.value1
				);
			}
			else
			{
				svResult = 0.0f;
				FAudio_assert(0 && "Equation flags?");
			}

			/* Add/Replace */
			if (evt->value.equation.flags & 0x01)
			{
				if(	evt->type == FACTEVENT_PITCH ||
					evt->type == FACTEVENT_PITCHREPEATING	)
				{
					evtInst->value = trackInst->evtPitch + svResult;
				}
				else
				{
					evtInst->value = trackInst->evtVolume + svResult;
				}
			}
			else
			{
				evtInst->value = svResult;
			}
		}

		/* Set the result, finally. */
		if (	evt->type == FACTEVENT_PITCH ||
			evt->type == FACTEVENT_PITCHREPEATING	)
		{
			trackInst->evtPitch = evtInst->value;
		}
		else
		{
			trackInst->evtVolume = evtInst->value;
		}

		if (skipLoopCheck)
		{
			return;
		}
		if (evtInst->loopCount > 0)
		{
			if (evtInst->loopCount != 0xFF && evtInst->loopCount != 0xFFFF)
			{
				evtInst->loopCount -= 1;
			}

			evtInst->timestamp += evt->value.frequency;
			return;
		}
	}

	/* MARKER */
	else if (	evt->type == FACTEVENT_MARKER ||
			evt->type == FACTEVENT_MARKERREPEATING	)
	{
		/* TODO: FACT_INTERNAL_Marker(evt->marker*) */
		if (evtInst->loopCount > 0)
		{
			if (evtInst->loopCount != 0xFF)
			{
				evtInst->loopCount -= 1;
			}

			evtInst->timestamp += evt->marker.frequency;
			return;
		}
	}

	/* ??? */
	else
	{
		FAudio_assert(0 && "Unknown event type!");
	}

	/* If we made it here, we're done! */
	evtInst->finished = 1;
}